

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

SequenceRepeatLayerParams * __thiscall
CoreML::Specification::SequenceRepeatLayerParams::New(SequenceRepeatLayerParams *this,Arena *arena)

{
  SequenceRepeatLayerParams *this_00;
  
  this_00 = (SequenceRepeatLayerParams *)operator_new(0x20);
  SequenceRepeatLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SequenceRepeatLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SequenceRepeatLayerParams* SequenceRepeatLayerParams::New(::google::protobuf::Arena* arena) const {
  SequenceRepeatLayerParams* n = new SequenceRepeatLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}